

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ScatterNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_scatternd(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3b1) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3b1;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    ScatterNDLayerParams::ScatterNDLayerParams(this_00.scatternd_);
    (this->layer_).scatternd_ = (ScatterNDLayerParams *)this_00;
  }
  return (ScatterNDLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ScatterNDLayerParams* NeuralNetworkLayer::mutable_scatternd() {
  if (!has_scatternd()) {
    clear_layer();
    set_has_scatternd();
    layer_.scatternd_ = new ::CoreML::Specification::ScatterNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.scatterND)
  return layer_.scatternd_;
}